

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O1

void __thiscall
mp::pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::
ModelValues(ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>
            *this,ParamType prm,string *nm)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar2 = (nm->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + nm->_M_string_length);
  (this->vars_).prm_ = prm;
  (this->vars_).name_._M_dataplus._M_p = (pointer)&(this->vars_).name_.field_2;
  (this->vars_).name_.field_2._M_allocated_capacity = 0x656d614e70614d56;
  *(undefined8 *)((long)&(this->vars_).name_.field_2 + 7) = 0x7465736e755f5f65;
  (this->vars_).name_._M_string_length = 0xf;
  (this->vars_).name_.field_2._M_local_buf[0xf] = '\0';
  p_Var1 = &(this->vars_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->vars_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vars_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vars_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vars_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vars_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cons_).prm_ = prm;
  (this->cons_).name_._M_dataplus._M_p = (pointer)&(this->cons_).name_.field_2;
  (this->cons_).name_.field_2._M_allocated_capacity = 0x656d614e70614d56;
  *(undefined8 *)((long)&(this->cons_).name_.field_2 + 7) = 0x7465736e755f5f65;
  (this->cons_).name_._M_string_length = 0xf;
  (this->cons_).name_.field_2._M_local_buf[0xf] = '\0';
  p_Var1 = &(this->cons_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->cons_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cons_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cons_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cons_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cons_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->objs_).prm_ = prm;
  (this->objs_).name_._M_dataplus._M_p = (pointer)&(this->objs_).name_.field_2;
  *(undefined8 *)((long)&(this->objs_).name_.field_2 + 7) = 0x7465736e755f5f65;
  (this->objs_).name_.field_2._M_allocated_capacity = 0x656d614e70614d56;
  (this->objs_).name_._M_string_length = 0xf;
  (this->objs_).name_.field_2._M_local_buf[0xf] = '\0';
  p_Var1 = &(this->objs_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->objs_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objs_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objs_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objs_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objs_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->p_extra_ = (void *)0x0;
  pcVar2 = (nm->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,pcVar2,pcVar2 + nm->_M_string_length)
  ;
  std::__cxx11::string::append((char *)local_48);
  std::__cxx11::string::operator=((string *)&(this->vars_).name_,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  pcVar2 = (nm->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,pcVar2,pcVar2 + nm->_M_string_length)
  ;
  std::__cxx11::string::append((char *)local_68);
  std::__cxx11::string::operator=((string *)&(this->cons_).name_,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = (nm->_M_dataplus)._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,pcVar2,pcVar2 + nm->_M_string_length)
  ;
  std::__cxx11::string::append((char *)local_88);
  std::__cxx11::string::operator=((string *)&(this->objs_).name_,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return;
}

Assistant:

ModelValues(ParamType prm, const std::string& nm) :
      name_{nm}, vars_(prm), cons_(prm), objs_(prm) {
    vars_.SetName(nm+"_vars");
    cons_.SetName(nm+"_cons");
    objs_.SetName(nm+"_objs");
  }